

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O2

bool Reflection::get<short>(Struct *target,string *name,short *value,size_t offset)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  long lVar5;
  long lVar6;
  type_info *this;
  undefined4 extraout_var_01;
  
  iVar3 = (*target->_vptr_Struct[1])();
  this = (type_info *)CONCAT44(extraout_var,iVar3);
  if (this != (type_info *)0x0) {
    bVar1 = std::type_info::operator==(this,(type_info *)&short::typeinfo);
    if (bVar1) {
      iVar3 = (*target->_vptr_Struct[5])(target,name);
      sVar2 = *(short *)(CONCAT44(extraout_var_00,iVar3) + offset * 2);
LAB_003cf19b:
      *value = sVar2;
      return true;
    }
    bVar1 = TypeInfo::is_integral(this);
    if (bVar1) {
      TypeInfo::is_signed(this);
      sVar4 = TypeInfo::size(this);
      if (sVar4 < 2) {
        iVar3 = (*target->_vptr_Struct[5])(target,name);
        lVar5 = CONCAT44(extraout_var_01,iVar3);
        lVar6 = sVar4 * offset;
        bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_char::typeinfo);
        if (bVar1) {
          *value = (ushort)*(byte *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&signed_char::typeinfo);
        if (bVar1) {
          *value = (short)*(char *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_short::typeinfo);
        if (bVar1) {
          *value = *(short *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&short::typeinfo);
        if (bVar1) {
          *value = *(short *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_int::typeinfo);
        if (bVar1) {
          *value = *(short *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&int::typeinfo);
        if (bVar1) {
          *value = *(short *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&unsigned_long::typeinfo);
        if (bVar1) {
          *value = *(short *)(lVar5 + lVar6);
        }
        bVar1 = std::type_info::operator==(this,(type_info *)&long::typeinfo);
        if (!bVar1) {
          return true;
        }
        sVar2 = *(short *)(lVar5 + lVar6);
        goto LAB_003cf19b;
      }
    }
  }
  return false;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}